

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_get(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  Integer IVar5;
  Integer IVar6;
  global_array_t *pgVar7;
  int iVar8;
  cache_struct *pcVar9;
  long lVar10;
  cache_struct_t *pcVar11;
  cache_struct_t *pcVar12;
  void *pvVar13;
  ulong uVar14;
  global_array_t *pgVar15;
  uint ndim;
  ulong uVar16;
  cache_struct_t **ppcVar17;
  cache_struct *pcVar18;
  int temp_hi [7];
  int temp_lo [7];
  Integer bstart [7];
  Integer nld [7];
  Integer ncount [7];
  Integer nstart [7];
  
  pgVar15 = GA;
  lVar1 = g_a + 1000;
  if (GA[lVar1].property == 2) {
    ndim = (uint)GA[lVar1].ndim;
    ppcVar17 = &GA[lVar1].cache_head;
    pcVar11 = *ppcVar17;
    if (pcVar11 != (cache_struct_t *)0x0) {
      uVar14 = 0;
      pcVar9 = pcVar11;
      if (0 < GA[lVar1].ndim) {
        uVar14 = (ulong)ndim;
      }
LAB_00167e95:
      if (pcVar9 != (cache_struct_t *)0x0) {
        pvVar13 = pcVar9->cache_buf;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          temp_lo[uVar16] = pcVar9->lo[uVar16];
          temp_hi[uVar16] = pcVar9->hi[uVar16];
        }
        uVar16 = 0;
LAB_00167ec4:
        if (uVar14 != uVar16) goto code_r0x00167ec9;
        for (lVar10 = 0; uVar14 * 4 != lVar10; lVar10 = lVar10 + 4) {
          lVar4 = *(long *)((long)lo + lVar10 * 2);
          iVar8 = *(int *)((long)temp_lo + lVar10);
          *(undefined8 *)((long)bstart + lVar10 * 2) = 0;
          *(long *)((long)nstart + lVar10 * 2) = lVar4 - iVar8;
          *(long *)((long)nld + lVar10 * 2) = (long)((*(int *)((long)temp_hi + lVar10) - iVar8) + 1)
          ;
          *(long *)((long)ncount + lVar10 * 2) = (*(long *)((long)hi + lVar10 * 2) - lVar4) + 1;
        }
        gai_mem_copy(GA[lVar1].elemsize,ndim,pvVar13,nstart,ncount,nld,buf,bstart,ncount);
        pgVar15 = GA;
        goto LAB_001680eb;
      }
      pcVar12 = (cache_struct_t *)malloc(0x48);
      iVar8 = 1;
      for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
        IVar5 = lo[uVar16];
        pcVar12->lo[uVar16] = (int)IVar5;
        IVar6 = hi[uVar16];
        pcVar12->hi[uVar16] = (int)IVar6;
        iVar8 = iVar8 * (((int)IVar6 - (int)IVar5) + 1);
      }
      pvVar13 = malloc((long)iVar8 * (long)pgVar15[lVar1].elemsize);
      pcVar12->cache_buf = pvVar13;
      pcVar12->next = pcVar11;
      *ppcVar17 = pcVar12;
      ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
      for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
        nstart[uVar16] = 0;
        bstart[uVar16] = 0;
        lVar10 = (hi[uVar16] - lo[uVar16]) + 1;
        nld[uVar16] = lVar10;
        ncount[uVar16] = lVar10;
      }
      iVar8 = GA[lVar1].elemsize;
      goto LAB_001680cc;
    }
    pcVar11 = (cache_struct_t *)malloc(0x48);
    *ppcVar17 = pcVar11;
    pgVar7 = GA;
    pgVar15 = GA + lVar1;
    uVar14 = 0;
    uVar16 = 0;
    if (0 < (int)ndim) {
      uVar16 = (ulong)ndim;
    }
    iVar8 = 1;
    for (; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      IVar5 = lo[uVar14];
      pcVar11 = pgVar15->cache_head;
      pcVar11->lo[uVar14] = (int)IVar5;
      IVar6 = hi[uVar14];
      pcVar11->hi[uVar14] = (int)IVar6;
      iVar8 = iVar8 * (((int)IVar6 - (int)IVar5) + 1);
    }
    pvVar13 = malloc((long)iVar8 * (long)pgVar7[lVar1].elemsize);
    pcVar11 = pgVar15->cache_head;
    pcVar11->cache_buf = pvVar13;
    pcVar11->next = (cache_struct *)0x0;
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      nstart[uVar14] = 0;
      bstart[uVar14] = 0;
      lVar10 = (hi[uVar14] - lo[uVar14]) + 1;
      nld[uVar14] = lVar10;
      ncount[uVar14] = lVar10;
    }
    iVar8 = GA[lVar1].elemsize;
LAB_001680cc:
    pgVar15 = GA;
    gai_mem_copy(iVar8,ndim,buf,bstart,ncount,ld,pvVar13,nstart,nld);
LAB_001680eb:
    pcVar11 = pgVar15[lVar1].cache_head;
    if (pcVar11 != (cache_struct_t *)0x0) {
      pcVar9 = pcVar11->next;
      pcVar11->next = (cache_struct *)0x0;
      pcVar18 = pcVar9;
      while (pcVar18 != (cache_struct *)0x0) {
        pcVar18 = pcVar9->next;
        free(pcVar9->cache_buf);
        free(pcVar9);
      }
    }
  }
  else {
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
  }
  return;
code_r0x00167ec9:
  if ((lo[uVar16] < (long)temp_lo[uVar16]) ||
     (piVar3 = temp_hi + uVar16, plVar2 = hi + uVar16, uVar16 = uVar16 + 1, (long)*piVar3 < *plVar2)
     ) goto LAB_00167ee6;
  goto LAB_00167ec4;
LAB_00167ee6:
  pcVar9 = pcVar9->next;
  goto LAB_00167e95;
}

Assistant:

void pnga_get(Integer g_a, Integer *lo, Integer *hi,
              void *buf, Integer *ld)
{
  Integer handle = GA_OFFSET + g_a;
  enum property_type ga_property = GA[handle].property;

  if (ga_property != READ_CACHE) /* if array is not read only */
  {
    GA_Internal_Threadsafe_Lock();
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);
    GA_Internal_Threadsafe_Unlock();
  } else {
    int i;
    int nelem;
    int ndim = GA[handle].ndim;
    Integer nstart[MAXDIM], ncount[MAXDIM], nld[MAXDIM];
    Integer bstart[MAXDIM];
    /* ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL); */

    /* cache is empty condition */
    if (GA[handle].cache_head == NULL) {
      GA[handle].cache_head = malloc(sizeof(cache_struct_t));
      nelem = 1;
      for (i=0; i<ndim; i++) {
        GA[handle].cache_head -> lo[i] = lo[i];
        GA[handle].cache_head -> hi[i] = hi[i];
        nelem *= (hi[i]-lo[i]+1);
      }
      GA[handle].cache_head -> cache_buf = malloc(GA[handle].elemsize*nelem);
      GA[handle].cache_head -> next = NULL;

        void *new_buf = GA[handle].cache_head->cache_buf;

      /* place data to receive buffer */
      ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer*)NULL);
   
      for (i=0; i<ndim; i++) {
        nstart[i] = 0;
        bstart[i] = 0;
        nld[i] = (hi[i]-lo[i]+1);
        ncount[i] = nld[i];
      }
      gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
          nstart, nld);
    } else {

      cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
      int match = 0;
      while (cache_temp_pointer != NULL) {
        int chk;
        int sub_chk;
        int temp_lo[MAXDIM];
        int temp_hi[MAXDIM];
        void *temp_buf = cache_temp_pointer->cache_buf;
        for (i=0; i<ndim; i++) {
          temp_lo[i] = cache_temp_pointer->lo[i];
          temp_hi[i] = cache_temp_pointer->hi[i];
        }

        //match
        chk = 1;
        for (i=0; i<ndim; i++) {
          if (!(temp_lo[i] <= lo[i] && temp_hi[i] >= hi[i])) {
            chk = 0;
            break;
          }
        }
        //match
        if (chk) {
          nelem = 1;
          for (i=0; i<ndim; i++) {
            nelem *= (hi[i]-lo[i]+1);
          }
          for (i=0; i<ndim; i++) {
            nstart[i] = (lo[i]-temp_lo[i]);
            bstart[i] = 0;
            nld[i] = (temp_hi[i]-temp_lo[i]+1);
            ncount[i] = (hi[i]-lo[i]+1);
          }
          /* copy data to recieve buffer */
          gai_mem_copy(GA[handle].elemsize,ndim,temp_buf,nstart,ncount,nld,buf,
              bstart, ncount /*ld*/);
          match = 1;
          break;
        }

        cache_temp_pointer = cache_temp_pointer->next;

      }

      //no match condition
      if (match == 0) {
        void *new_buf;
        /* create new node on cache list*/
        cache_struct_t *cache_new = malloc(sizeof(cache_struct_t));
        nelem = 1;
        for (i=0; i<ndim; i++) {
          cache_new -> lo[i] = lo[i];
          cache_new -> hi[i] = hi[i];
          nelem *= (hi[i]-lo[i]+1);
        }
        cache_new -> cache_buf = malloc(GA[handle].elemsize*nelem);
        new_buf = cache_new->cache_buf;
        cache_new -> next = GA[handle].cache_head;
        GA[handle].cache_head = cache_new;


        //place data to recieve buffer
        ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);

        for (i=0; i<ndim; i++) {
          nstart[i] = 0;
          bstart[i] = 0;
          nld[i] = (hi[i]-lo[i]+1);
          ncount[i] = nld[i];
        }
        gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
            nstart, nld);
      }
    }

    /* check number of items cached */
    cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
    int cache_size = 0;

    /* check number of items cached */
    while (cache_temp_pointer != NULL) {
      if (cache_size > MAXCACHE) {
        cache_struct_t *last = cache_temp_pointer;
        cache_struct_t *next = last->next;
        last->next = NULL;
        cache_temp_pointer = next;
        while (next) {
          next = cache_temp_pointer->next;
          free(cache_temp_pointer->cache_buf);
          free(cache_temp_pointer);
        }
        break;
      }
      cache_size++;
    }
    /* end */
  }
}